

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O1

void __thiscall
nuraft::peer::handle_rpc_result
          (peer *this,ptr<peer> *myself,ptr<rpc_client> *my_rpc_client,ptr<req_msg> *req,
          ptr<rpc_result> *pending_result,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  msg_type mVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Hash_node_base *p_Var6;
  element_type *peVar7;
  ptr<rpc_result> *ppVar8;
  ptr<resp_msg> *result;
  _Alloc_hider _Var9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  msg_type type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  ptr<rpc_exception> no_except;
  ptr<resp_msg> no_resp;
  undefined1 local_aa;
  undefined1 local_a9;
  string local_a8;
  ptr<rpc_result> *local_88;
  uint local_80;
  uint local_7c;
  ptr<peer> *local_78;
  ptr<resp_msg> *local_70;
  string local_68;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
       ::msg_types_to_free == '\0') &&
     (iVar10 = __cxa_guard_acquire(&handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
                                    ::msg_types_to_free), iVar10 != 0)) {
    local_a8.field_2._M_allocated_capacity = 0x1c0000000e;
    local_a8.field_2._8_8_ = 0x180000001a;
    local_a8._M_dataplus._M_p = (pointer)0x1000000003;
    local_a8._M_string_length = 0x1400000001;
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<int_const*>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&handle_rpc_result::msg_types_to_free,&local_a8,&local_88,0,&local_68,&local_a9,
               &local_aa);
    __cxa_atexit(std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                 ~unordered_set,&handle_rpc_result::msg_types_to_free,&__dso_handle);
    __cxa_guard_release(&handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
                         ::msg_types_to_free);
  }
  if (((this->abandoned_)._M_base._M_i & 1U) == 0) {
    local_78 = myself;
    local_70 = resp;
    if ((((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) &&
        (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar2 != (element_type *)0x0)) &&
       (iVar10 = (**(code **)(*(long *)peVar2 + 0x38))(), 5 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar3 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_7c = (peVar3->super_msg_base).src_;
      local_80 = (peVar3->super_msg_base).dst_;
      local_88 = pending_result;
      msg_type_to_string_abi_cxx11_(&local_68,(nuraft *)(ulong)(peVar3->super_msg_base).type_,type);
      _Var9._M_p = local_68._M_dataplus._M_p;
      peVar4 = (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        pcVar11 = "OK";
      }
      else {
        pcVar11 = (char *)(**(code **)(*(long *)peVar4 + 0x10))();
      }
      msg_if_given_abi_cxx11_
                (&local_a8,"resp of req %d -> %d, type %s, %s",(ulong)local_7c,(ulong)local_80,
                 _Var9._M_p,pcVar11);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"handle_rpc_result",0x6b,&local_a8);
      pending_result = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    if ((err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->rpc_protector_);
      if (iVar10 != 0) {
LAB_0011d82c:
        std::__throw_system_error(iVar10);
      }
      peVar5 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar5 == (element_type *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = (**(code **)(*(long *)peVar5 + 0x18))();
      }
      peVar5 = (my_rpc_client->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_88 = pending_result;
      if (peVar5 == (element_type *)0x0) {
        lVar13 = 0;
      }
      else {
        lVar13 = (**(code **)(*(long *)peVar5 + 0x18))();
      }
      if (lVar12 == lVar13) {
        mVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_msg_base).type_;
        p_Var15 = handle_rpc_result::msg_types_to_free._M_h._M_buckets
                  [(ulong)(long)(int)mVar1 %
                   handle_rpc_result::msg_types_to_free._M_h._M_bucket_count];
        p_Var16 = (__node_base_ptr)0x0;
        if ((p_Var15 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var15->_M_nxt, p_Var16 = p_Var15,
           mVar1 != *(msg_type *)&p_Var15->_M_nxt[1]._M_nxt)) {
          while (p_Var15 = p_Var6, p_Var6 = p_Var15->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var16 = (__node_base_ptr)0x0;
            if (((ulong)(long)(int)*(msg_type *)&p_Var6[1]._M_nxt %
                 handle_rpc_result::msg_types_to_free._M_h._M_bucket_count !=
                 (ulong)(long)(int)mVar1 % handle_rpc_result::msg_types_to_free._M_h._M_bucket_count
                ) || (p_Var16 = p_Var15, mVar1 == *(msg_type *)&p_Var6[1]._M_nxt))
            goto LAB_0011d69a;
          }
          p_Var16 = (__node_base_ptr)0x0;
        }
LAB_0011d69a:
        if ((p_Var16 != (__node_base_ptr)0x0) && (p_Var16->_M_nxt != (_Hash_node_base *)0x0)) {
          LOCK();
          (this->busy_flag_)._M_base._M_i = false;
          UNLOCK();
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar10 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar10)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a8,
                     "[EDGE CASE] got stale RPC response from %d: current %p (%lu), from parameter %p (%lu). will ignore this response"
                     ,(ulong)(uint)((this->config_).
                                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->id_,
                     (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,lVar12,
                     (my_rpc_client->
                     super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     lVar13);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"handle_rpc_result",0x7d,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
      if (lVar12 != lVar13) {
        return;
      }
      timer_helper::reset(&this->last_active_timer_);
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
      if (iVar10 != 0) goto LAB_0011d82c;
      LOCK();
      (this->current_hb_interval_).super___atomic_base<int>._M_i = this->hb_interval_;
      UNLOCK();
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
      result = local_70;
      ppVar8 = local_88;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      peVar7 = (local_70->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40 = (local_78->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_38._M_pi =
           (local_78->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        }
      }
      (peVar7->peer_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar7->peer_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_38);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
      set_result((ppVar8->
                 super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr,result,(shared_ptr<nuraft::rpc_exception> *)&local_a8,OK);
      timer_helper::reset(&this->reconn_backoff_);
      timer_helper::set_duration_us(&this->reconn_backoff_,1000);
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length;
    }
    else {
      timer_helper::reset(&this->last_active_timer_);
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
      if (iVar10 != 0) goto LAB_0011d82c;
      iVar10 = (this->current_hb_interval_).super___atomic_base<int>._M_i + this->rpc_backoff_;
      if (this->max_hb_interval_ <= iVar10) {
        iVar10 = this->max_hb_interval_;
      }
      LOCK();
      (this->current_hb_interval_).super___atomic_base<int>._M_i = iVar10;
      UNLOCK();
      pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
      set_result((pending_result->
                 super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr,(shared_ptr<nuraft::resp_msg> *)&local_68,err,OK);
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->rpc_protector_);
      if (iVar10 != 0) {
        std::__throw_system_error(iVar10);
      }
      peVar5 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar5 == (element_type *)0x0) {
        lVar12 = 0;
      }
      else {
        lVar12 = (**(code **)(*(long *)peVar5 + 0x18))();
      }
      peVar5 = (my_rpc_client->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar5 == (element_type *)0x0) {
        lVar13 = 0;
      }
      else {
        lVar13 = (**(code **)(*(long *)peVar5 + 0x18))();
      }
      if (lVar12 == lVar13) {
        p_Var14 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        mVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_msg_base).type_;
        p_Var15 = handle_rpc_result::msg_types_to_free._M_h._M_buckets
                  [(ulong)(long)(int)mVar1 %
                   handle_rpc_result::msg_types_to_free._M_h._M_bucket_count];
        p_Var16 = (__node_base_ptr)0x0;
        if ((p_Var15 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var15->_M_nxt, p_Var16 = p_Var15,
           mVar1 != *(msg_type *)&p_Var15->_M_nxt[1]._M_nxt)) {
          while (p_Var15 = p_Var6, p_Var6 = p_Var15->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var16 = (__node_base_ptr)0x0;
            if (((ulong)(long)(int)*(msg_type *)&p_Var6[1]._M_nxt %
                 handle_rpc_result::msg_types_to_free._M_h._M_bucket_count !=
                 (ulong)(long)(int)mVar1 % handle_rpc_result::msg_types_to_free._M_h._M_bucket_count
                ) || (p_Var16 = p_Var15, mVar1 == *(msg_type *)&p_Var6[1]._M_nxt))
            goto LAB_0011d672;
          }
          p_Var16 = (__node_base_ptr)0x0;
        }
LAB_0011d672:
        if ((p_Var16 != (__node_base_ptr)0x0) && (p_Var16->_M_nxt != (_Hash_node_base *)0x0)) {
          LOCK();
          (this->busy_flag_)._M_base._M_i = false;
          UNLOCK();
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar10 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar10)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a8,
                     "[EDGE CASE] RPC for %d has been reset before returning error: current %p (%lu), from parameter %p (%lu)"
                     ,(ulong)(uint)((this->config_).
                                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->id_,
                     (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,lVar12,
                     (my_rpc_client->
                     super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     lVar13);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"handle_rpc_result",0xb9,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length;
    }
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar10 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar10)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a8,"peer %d has been shut down, ignore response.",
                 (ulong)(uint)((this->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                 ,"handle_rpc_result",0x62,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void peer::handle_rpc_result( ptr<peer> myself,
                              ptr<rpc_client> my_rpc_client,
                              ptr<req_msg>& req,
                              ptr<rpc_result>& pending_result,
                              ptr<resp_msg>& resp,
                              ptr<rpc_exception>& err )
{
    const static std::unordered_set<int> msg_types_to_free( {
        msg_type::append_entries_request,
        msg_type::install_snapshot_request,
        msg_type::request_vote_request,
        msg_type::pre_vote_request,
        msg_type::leave_cluster_request,
        msg_type::custom_notification_request,
        msg_type::reconnect_request,
        msg_type::priority_change_request
    } );

    if (abandoned_) {
        p_in("peer %d has been shut down, ignore response.", config_->get_id());
        return;
    }

    if (req) {
        p_tr( "resp of req %d -> %d, type %s, %s",
              req->get_src(),
              req->get_dst(),
              msg_type_to_string( req->get_type() ).c_str(),
              (err) ? err->what() : "OK" );
    }

    if (err == nilptr) {
        // Succeeded.
        {   std::lock_guard<std::mutex> l(rpc_protector_);
            // The same as below, freeing busy flag should be done
            // only if the RPC hasn't been changed.
            uint64_t cur_rpc_id = rpc_ ? rpc_->get_id() : 0;
            uint64_t given_rpc_id = my_rpc_client ? my_rpc_client->get_id() : 0;
            if (cur_rpc_id != given_rpc_id) {
                p_wn( "[EDGE CASE] got stale RPC response from %d: "
                      "current %p (%" PRIu64 "), from parameter %p (%" PRIu64 "). "
                      "will ignore this response",
                      config_->get_id(),
                      rpc_.get(),
                      cur_rpc_id,
                      my_rpc_client.get(),
                      given_rpc_id );
                return;
            }
            // WARNING:
            //   `set_free()` should be protected by `rpc_protector_`, otherwise
            //   it may free the peer even though new RPC client is already created.
            if ( msg_types_to_free.find(req->get_type()) != msg_types_to_free.end() ) {
                set_free();
            }
        }

        reset_active_timer();
        {
            auto_lock(lock_);
            resume_hb_speed();
        }
        ptr<rpc_exception> no_except;
        resp->set_peer(myself);
        pending_result->set_result(resp, no_except);

        reconn_backoff_.reset();
        reconn_backoff_.set_duration_ms(1);

    } else {
        // Failed.

        // NOTE: Explicit failure is also treated as an activity
        //       of that connection.
        reset_active_timer();
        {
            auto_lock(lock_);
            slow_down_hb();
        }
        ptr<resp_msg> no_resp;
        pending_result->set_result(no_resp, err);

        // Destroy this connection, we MUST NOT re-use existing socket.
        // Next append operation will create a new one.
        {   std::lock_guard<std::mutex> l(rpc_protector_);
            uint64_t cur_rpc_id = rpc_ ? rpc_->get_id() : 0;
            uint64_t given_rpc_id = my_rpc_client ? my_rpc_client->get_id() : 0;
            if (cur_rpc_id == given_rpc_id) {
                rpc_.reset();
                if ( msg_types_to_free.find(req->get_type()) !=
                         msg_types_to_free.end() ) {
                    set_free();
                }

            } else {
                // WARNING (MONSTOR-9378):
                //   RPC client has been reset before this request returns
                //   error. Those two are different instances and we
                //   SHOULD NOT reset the new one.
                p_wn( "[EDGE CASE] RPC for %d has been reset before "
                      "returning error: current %p (%" PRIu64
                      "), from parameter %p (%" PRIu64 ")",
                      config_->get_id(),
                      rpc_.get(),
                      cur_rpc_id,
                      my_rpc_client.get(),
                      given_rpc_id );
            }
        }
    }
}